

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.cpp
# Opt level: O2

bool __thiscall
wallet::DecryptSecret
          (wallet *this,CKeyingMaterial *master_key,
          span<const_unsigned_char,_18446744073709551615UL> ciphertext,uint256 *iv,
          CKeyingMaterial *plaintext)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  span<const_unsigned_char,_18446744073709551615UL> ciphertext_00;
  span<const_unsigned_char,_18446744073709551615UL> new_iv;
  CCrypter key_crypter;
  
  ciphertext_00._M_extent._M_extent_value = (size_t)ciphertext._M_ptr;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CCrypter::CCrypter(&key_crypter);
  new_iv._M_extent._M_extent_value = 0x10;
  new_iv._M_ptr = (pointer)ciphertext._M_extent._M_extent_value._M_extent_value;
  bVar2 = CCrypter::SetKey(&key_crypter,(CKeyingMaterial *)this,new_iv);
  if (bVar2) {
    ciphertext_00._M_ptr = (pointer)master_key;
    bVar2 = CCrypter::Decrypt(&key_crypter,ciphertext_00,(CKeyingMaterial *)iv);
  }
  else {
    bVar2 = false;
  }
  CCrypter::~CCrypter(&key_crypter);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool DecryptSecret(const CKeyingMaterial& master_key, const std::span<const unsigned char> ciphertext, const uint256& iv, CKeyingMaterial& plaintext)
{
    CCrypter key_crypter;
    static_assert(WALLET_CRYPTO_IV_SIZE <= std::remove_reference_t<decltype(iv)>::size());
    const std::span iv_prefix{iv.data(), WALLET_CRYPTO_IV_SIZE};
    if (!key_crypter.SetKey(master_key, iv_prefix)) {
        return false;
    }
    return key_crypter.Decrypt(ciphertext, plaintext);
}